

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::ImageLoadStoreTestInstance::ImageLoadStoreTestInstance
          (ImageLoadStoreTestInstance *this,Context *context,Texture *texture,VkFormat format,
          VkFormat imageFormat,bool declareImageFormatInShader,bool singleLayerBind)

{
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data_00;
  Allocator *pAVar1;
  Allocator *pAVar2;
  int iVar3;
  Image *pIVar4;
  uint uVar5;
  undefined4 in_stack_fffffffffffffdbc;
  undefined8 in_stack_fffffffffffffdc0;
  VkDevice pVVar6;
  DefaultDeleter<vkt::image::Image> local_15d;
  deUint32 local_15c;
  VkImageCreateInfo local_158;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> local_100;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *local_f0;
  DefaultDeleter<vkt::image::Image> local_dd;
  deUint32 local_dc;
  VkImageCreateInfo local_d8;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> local_80;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *local_70;
  VkImageCreateFlags local_5c;
  Allocator *pAStack_58;
  VkImageCreateFlags imageFlags;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  undefined1 local_2a;
  undefined1 local_29;
  VkFormat local_28;
  bool singleLayerBind_local;
  VkFormat VStack_24;
  bool declareImageFormatInShader_local;
  VkFormat imageFormat_local;
  VkFormat format_local;
  Texture *texture_local;
  Context *context_local;
  ImageLoadStoreTestInstance *this_local;
  
  local_2a = singleLayerBind;
  uVar5 = (uint)singleLayerBind;
  local_29 = declareImageFormatInShader;
  local_28 = imageFormat;
  VStack_24 = format;
  _imageFormat_local = texture;
  texture_local = (Texture *)context;
  context_local = (Context *)this;
  LoadStoreTestInstance::LoadStoreTestInstance
            (&this->super_LoadStoreTestInstance,context,texture,format,imageFormat,
             declareImageFormatInShader,singleLayerBind);
  (this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ImageLoadStoreTestInstance_0166c0d8;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            (&this->m_imageSrc);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            (&this->m_imageDst);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  iVar3 = Texture::numLayers(_imageFormat_local);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
            ((long)&vk + 3));
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&this->m_allDescriptorSets,(long)iVar3,
           (allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
           ((long)&vk + 3));
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  ~allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
             ((long)&vk + 3));
  iVar3 = Texture::numLayers(_imageFormat_local);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>::
  allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
            ((long)&vk + 2));
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&this->m_allSrcImageViews,(long)iVar3,
           (allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
           ((long)&vk + 2));
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>::
  ~allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
             ((long)&vk + 2));
  iVar3 = Texture::numLayers(_imageFormat_local);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>::
  allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
            ((long)&vk + 1));
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&this->m_allDstImageViews,(long)iVar3,
           (allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
           ((long)&vk + 1));
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>::
  ~allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
             ((long)&vk + 1));
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                      m_context);
  allocator = (Allocator *)
              Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                                 super_TestInstance.m_context);
  pAStack_58 = Context::getDefaultAllocator
                         ((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                          super_TestInstance.m_context);
  local_5c = (uint)((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format !=
                   (this->super_LoadStoreTestInstance).m_imageFormat) << 3;
  pIVar4 = (Image *)operator_new(0x30);
  pVVar6 = device;
  pAVar2 = allocator;
  pAVar1 = pAStack_58;
  image::makeImageCreateInfo
            (&local_d8,&(this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture,
             (this->super_LoadStoreTestInstance).m_imageFormat,10,local_5c);
  local_dc = ::vk::MemoryRequirement::Any.m_flags;
  image::Image::Image(pIVar4,(DeviceInterface *)pVVar6,(VkDevice)pAVar2,pAVar1,&local_d8,
                      ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Image>::DefaultDeleter(&local_dd);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_80);
  local_70 = de::details::MovePtr::operator_cast_to_PtrData(&local_80,(MovePtr *)pIVar4);
  data.ptr._4_4_ = in_stack_fffffffffffffdbc;
  data.ptr._0_4_ = uVar5;
  data._8_8_ = in_stack_fffffffffffffdc0;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::operator=
            (&this->m_imageSrc,data);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_80);
  pIVar4 = (Image *)operator_new(0x30);
  pAVar2 = allocator;
  pAVar1 = pAStack_58;
  pVVar6 = device;
  image::makeImageCreateInfo
            (&local_158,&(this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture,
             (this->super_LoadStoreTestInstance).m_imageFormat,9,local_5c);
  local_15c = ::vk::MemoryRequirement::Any.m_flags;
  image::Image::Image(pIVar4,(DeviceInterface *)pVVar6,(VkDevice)pAVar2,pAVar1,&local_158,
                      ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Image>::DefaultDeleter(&local_15d);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_100);
  local_f0 = de::details::MovePtr::operator_cast_to_PtrData(&local_100,(MovePtr *)pIVar4);
  data_00.ptr._4_4_ = in_stack_fffffffffffffdbc;
  data_00.ptr._0_4_ = uVar5;
  data_00._8_8_ = pVVar6;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::operator=
            (&this->m_imageDst,data_00);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_100);
  return;
}

Assistant:

ImageLoadStoreTestInstance::ImageLoadStoreTestInstance (Context&		context,
														const Texture&	texture,
														const VkFormat	format,
														const VkFormat	imageFormat,
														const bool		declareImageFormatInShader,
														const bool		singleLayerBind)
	: LoadStoreTestInstance	(context, texture, format, imageFormat, declareImageFormatInShader, singleLayerBind)
	, m_allDescriptorSets	(texture.numLayers())
	, m_allSrcImageViews	(texture.numLayers())
	, m_allDstImageViews	(texture.numLayers())
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();
	Allocator&					allocator			= m_context.getDefaultAllocator();
	const VkImageCreateFlags	imageFlags			= (m_format == m_imageFormat ? 0u : (VkImageCreateFlags)VK_IMAGE_CREATE_MUTABLE_FORMAT_BIT);

	m_imageSrc = de::MovePtr<Image>(new Image(
		vk, device, allocator,
		makeImageCreateInfo(m_texture, m_imageFormat, VK_IMAGE_USAGE_STORAGE_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT, imageFlags),
		MemoryRequirement::Any));

	m_imageDst = de::MovePtr<Image>(new Image(
		vk, device, allocator,
		makeImageCreateInfo(m_texture, m_imageFormat, VK_IMAGE_USAGE_STORAGE_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, imageFlags),
		MemoryRequirement::Any));
}